

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arm.cpp
# Opt level: O2

void arm::display_reg_name(ostream *o,Reg r)

{
  RegisterKind RVar1;
  char *pcVar2;
  
  if (r == 0xf) {
    pcVar2 = "pc";
  }
  else if (r == 0xe) {
    pcVar2 = "lr";
  }
  else {
    if (r != 0xd) {
      RVar1 = register_type(r);
      (*(code *)(&DAT_00195374 + *(int *)(&DAT_00195374 + (ulong)RVar1 * 4)))();
      return;
    }
    pcVar2 = "sp";
  }
  std::operator<<(o,pcVar2);
  return;
}

Assistant:

void display_reg_name(std::ostream &o, Reg r) {
  if (r == REG_SP)
    o << "sp";
  else if (r == REG_LR)
    o << "lr";
  else if (r == REG_PC)
    o << "pc";
  else
    switch (register_type(r)) {
      case RegisterKind::GeneralPurpose:
        o << "r" << register_num(r);
        break;
      case RegisterKind::DoubleVector:
        o << "d" << register_num(r);
        break;
      case RegisterKind::QuadVector:
        o << "q" << register_num(r);
        break;
      case RegisterKind::VirtualGeneralPurpose:
        o << "v" << register_num(r);
        break;
      case RegisterKind::VirtualDoubleVector:
        o << "vd" << register_num(r);
        break;
      case RegisterKind::VirtualQuadVector:
        o << "vq" << register_num(r);
        break;
    }
}